

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrShadingContext.hpp
# Opt level: O3

Vector<float,_4> __thiscall
rr::readLineVarying<float>
          (rr *this,FragmentPacket *packet,FragmentShadingContext *context,int varyingLoc,
          int fragNdx)

{
  GenericVec4 *pGVar1;
  float fVar2;
  float fVar3;
  GenericVec4 GVar4;
  float fVar5;
  float fVar6;
  Vector<float,_4> *res;
  Vector<float,_4> VVar7;
  
  pGVar1 = context->varyings[0] + varyingLoc;
  fVar5 = (pGVar1->v).fData[2];
  fVar6 = (pGVar1->v).fData[3];
  fVar2 = packet->barycentric[0].m_data[fragNdx];
  fVar3 = packet->barycentric[1].m_data[fragNdx];
  VVar7.m_data[2] = fVar2 * (pGVar1->v).fData[0];
  VVar7.m_data[3] = fVar2 * (pGVar1->v).fData[1];
  GVar4.v = *(anon_union_16_3_1194ccdc_for_v *)context->varyings[1][varyingLoc].v.uData;
  VVar7.m_data._0_8_ = GVar4.v._0_8_;
  *(float *)this = fVar3 * GVar4.v._0_4_ + VVar7.m_data[2];
  *(float *)(this + 4) = fVar3 * GVar4.v._4_4_ + VVar7.m_data[3];
  *(float *)(this + 8) = fVar3 * GVar4.v._8_4_ + fVar2 * fVar5;
  *(float *)(this + 0xc) = fVar3 * GVar4.v._12_4_ + fVar2 * fVar6;
  return (Vector<float,_4>)VVar7.m_data;
}

Assistant:

tcu::Vector<T, 4> readLineVarying (const FragmentPacket& packet, const FragmentShadingContext& context, int varyingLoc, int fragNdx)
{
	return   packet.barycentric[0][fragNdx] * context.varyings[0][varyingLoc].get<T>()
		   + packet.barycentric[1][fragNdx] * context.varyings[1][varyingLoc].get<T>();
}